

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversionTypesSectionParser.cpp
# Opt level: O2

void __thiscall
OpenMD::InversionTypesSectionParser::parseLine
          (InversionTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  int iVar1;
  InversionType *inversionType;
  InversionTypeParser itParser;
  string at1;
  string remainder;
  string at4;
  string at3;
  string at2;
  StringTokenizer tokenizer;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>_>
  local_140;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  StringTokenizer local_70;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140," ;\t\n\r",(allocator<char> *)&local_110);
  StringTokenizer::StringTokenizer(&local_70,line,(string *)&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  InversionTypeParser::InversionTypeParser((InversionTypeParser *)&local_140);
  iVar1 = StringTokenizer::countTokens(&local_70);
  if (iVar1 < 5) {
    snprintf(painCave.errMsg,2000,
             "InversionTypesSectionParser Error: Not enough tokens at line %d\n",(ulong)(uint)lineNo
            );
    painCave.isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(&local_110,&local_70);
    StringTokenizer::nextToken_abi_cxx11_(&local_90,&local_70);
    StringTokenizer::nextToken_abi_cxx11_(&local_b0,&local_70);
    StringTokenizer::nextToken_abi_cxx11_(&local_d0,&local_70);
    StringTokenizer::getRemainingString_abi_cxx11_(&local_f0,&local_70);
    inversionType = InversionTypeParser::parseLine((InversionTypeParser *)&local_140,&local_f0);
    if (inversionType != (InversionType *)0x0) {
      ForceField::addInversionType(ff,&local_110,&local_90,&local_b0,&local_d0,inversionType);
    }
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_110);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>_>
  ::~_Rb_tree(&local_140);
  StringTokenizer::~StringTokenizer(&local_70);
  return;
}

Assistant:

void InversionTypesSectionParser::parseLine(ForceField& ff,
                                              const std::string& line,
                                              int lineNo) {
    StringTokenizer tokenizer(line);
    InversionTypeParser itParser;
    InversionType* inversionType = NULL;

    int nTokens = tokenizer.countTokens();

    if (nTokens < 5) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "InversionTypesSectionParser Error: Not enough tokens at line %d\n",
          lineNo);
      painCave.isFatal = 1;
      simError();
      return;
    }

    std::string at1       = tokenizer.nextToken();
    std::string at2       = tokenizer.nextToken();
    std::string at3       = tokenizer.nextToken();
    std::string at4       = tokenizer.nextToken();
    std::string remainder = tokenizer.getRemainingString();

    try {
      inversionType = itParser.parseLine(remainder);
    } catch (OpenMDException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "InversionTypesSectionParser Error: %s "
               "at line %d\n",
               e.what(), lineNo);
      painCave.isFatal = 1;
      simError();
    }

    if (inversionType != NULL) {
      ff.addInversionType(at1, at2, at3, at4, inversionType);
    }
  }